

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusplatformmenu.cpp
# Opt level: O2

void __thiscall QDBusPlatformMenu::syncMenuItem(QDBusPlatformMenu *this,QPlatformMenuItem *menuItem)

{
  QDBusMenuItemList _t1;
  QDBusMenuItemKeysList _t2;
  int *piVar1;
  qsizetype qVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  undefined1 local_98 [20];
  undefined4 local_84;
  char *local_80;
  undefined1 local_78 [24];
  undefined8 uStack_60;
  qsizetype local_58;
  QArrayDataPointer<QDBusMenuItem> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(QDBusPlatformMenu **)&menuItem[2].field_0x8 != (QDBusPlatformMenu *)0x0) {
    syncSubMenu(this,*(QDBusPlatformMenu **)&menuItem[2].field_0x8);
  }
  local_48.d = (Data *)0x0;
  local_48.ptr = (QDBusMenuItem *)0x0;
  local_48.size = 0;
  local_78._16_8_ = (int *)0x0;
  uStack_60 = 0;
  local_58 = 0;
  QDBusMenuItem::QDBusMenuItem((QDBusMenuItem *)local_98,(QDBusPlatformMenuItem *)menuItem);
  QList<QDBusMenuItem>::emplaceBack<QDBusMenuItem>
            ((QList<QDBusMenuItem> *)&local_48,(QDBusMenuItem *)local_98);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
              *)(local_98 + 8));
  QtPrivateLogging::qLcMenu();
  if (((byte)QtPrivateLogging::qLcMenu::category.field_2.bools.enabledDebug._q_value._M_base._M_i &
      1) != 0) {
    local_98._0_4_ = 2;
    local_98._4_8_ = 0;
    local_98._12_8_ = 0;
    local_84 = 0;
    local_80 = QtPrivateLogging::qLcMenu::category.name;
    QMessageLogger::debug();
    ::operator<<((Stream *)(local_78 + 8),(QList<QDBusMenuItem> *)local_78);
    QDebug::~QDebug((QDebug *)(local_78 + 8));
    QDebug::~QDebug((QDebug *)local_78);
  }
  if (local_48.d == (Data *)0x0) {
    qVar2 = 0;
    uVar3 = 0;
    piVar1 = (int *)0x0;
  }
  else {
    LOCK();
    ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    piVar1 = (int *)local_78._16_8_;
    qVar2 = local_58;
    uVar3 = uStack_60;
  }
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  _t1.d.ptr = (QDBusMenuItem *)uVar3;
  _t1.d.d = (Data *)piVar1;
  _t1.d.size = qVar2;
  _t2.d.ptr = (QDBusMenuItemKeys *)local_48.ptr;
  _t2.d.d = (Data *)local_48.d;
  _t2.d.size = local_48.size;
  propertiesUpdated(this,_t1,_t2);
  QArrayDataPointer<QDBusMenuItemKeys>::~QArrayDataPointer
            ((QArrayDataPointer<QDBusMenuItemKeys> *)&stack0xffffffffffffff38);
  QArrayDataPointer<QDBusMenuItem>::~QArrayDataPointer
            ((QArrayDataPointer<QDBusMenuItem> *)&stack0xffffffffffffff50);
  QArrayDataPointer<QDBusMenuItemKeys>::~QArrayDataPointer
            ((QArrayDataPointer<QDBusMenuItemKeys> *)(local_78 + 0x10));
  QArrayDataPointer<QDBusMenuItem>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusPlatformMenu::syncMenuItem(QPlatformMenuItem *menuItem)
{
    QDBusPlatformMenuItem *item = static_cast<QDBusPlatformMenuItem *>(menuItem);
    // if a submenu was added to this item, we need to connect to its signals
    if (item->menu())
        syncSubMenu(static_cast<const QDBusPlatformMenu *>(item->menu()));
    // TODO keep around copies of the QDBusMenuLayoutItems so they can be updated?
    // or eliminate them by putting dbus streaming operators in this class instead?
    // or somehow tell the dbusmenu client that something has changed, so it will ask for properties again
    QDBusMenuItemList updated;
    QDBusMenuItemKeysList removed;
    updated << QDBusMenuItem(item);
    qCDebug(qLcMenu) << updated;
    emit propertiesUpdated(updated, removed);
}